

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  char *pcVar1;
  string *psVar2;
  allocator local_1a;
  undefined1 local_19;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *this_local;
  string *dir;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  pcVar1 = cmLocalGenerator::GetCurrentBinaryDirectory(this->LocalGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  pcVar1 = cmake::GetCMakeFilesDirectory();
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  psVar2 = GetName_abi_cxx11_(this);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar2);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".dir");
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetSupportDirectory() const
{
  std::string dir = this->LocalGenerator->GetCurrentBinaryDirectory();
  dir += cmake::GetCMakeFilesDirectory();
  dir += "/";
  dir += this->GetName();
#if defined(__VMS)
  dir += "_dir";
#else
  dir += ".dir";
#endif
  return dir;
}